

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader14.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader14::data__wrap_t____fx_sampler_wrap_common
          (LibraryEffectsLoader14 *this,ENUM__fx_sampler_wrap_common value)

{
  byte bVar1;
  undefined4 in_ESI;
  long in_RDI;
  ENUM__fx_sampler_wrap_common newValue;
  undefined4 local_10;
  
  switch(in_ESI) {
  case 0:
    local_10 = 0;
    break;
  case 1:
    local_10 = 1;
    break;
  case 2:
    local_10 = 2;
    break;
  case 3:
    local_10 = 4;
    break;
  case 4:
    local_10 = 5;
    break;
  case 5:
    local_10 = 6;
    break;
  case 6:
    local_10 = 7;
  }
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x20) + 400))(*(long **)(in_RDI + 0x20),local_10);
  return (bool)(bVar1 & 1);
}

Assistant:

bool LibraryEffectsLoader14::data__wrap_t____fx_sampler_wrap_common( const COLLADASaxFWL14::ENUM__fx_sampler_wrap_common value )
{
SaxVirtualFunctionTest14(data__wrap_t____fx_sampler_wrap_common(value));
COLLADASaxFWL::ENUM__fx_sampler_wrap_common newValue;
switch (value) {
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__NONE: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__NONE; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__WRAP: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__WRAP; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__MIRROR: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__MIRROR; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__CLAMP: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__CLAMP; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__BORDER: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__BORDER; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__COUNT: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__COUNT; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__NOT_PRESENT: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__NOT_PRESENT; break;
}
return mLoader->data__wrap_t____fx_sampler_wrap_common(newValue);
}